

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-prepared.c
# Opt level: O0

char * borg_prepared_aux(wchar_t depth)

{
  int iVar1;
  wchar_t spell_stat;
  wchar_t basics;
  wchar_t depth_local;
  
  if (borg.ready_morgoth == L'\xffffffff') {
    borg.ready_morgoth = L'\0';
  }
  if (borg.trait[0x6b] == 0) {
    if (depth == L'\0') {
      _basics = (char *)0x0;
    }
    else if (borg.trait[0x1a] < 1) {
      _basics = "1 Lite";
    }
    else if (borg.trait[0x27] < 5) {
      _basics = "5 Food";
    }
    else if (depth < L'\x02') {
      _basics = (char *)0x0;
    }
    else if ((borg.trait[0xd5] < 5) && (borg.trait[0x1a] == 0)) {
      _basics = "5 Fuel";
    }
    else if ((borg_cfg[10] == 0) && (borg.trait[0x1c] < 0x1e)) {
      _basics = "30 hp";
    }
    else if (depth < L'\x03') {
      _basics = (char *)0x0;
    }
    else {
      if (borg_cfg[10] == 0) {
        switch(borg.trait[0x19]) {
        case 0:
        case 8:
          if (borg.trait[0x1c] < 0x32) {
            _basics = "50 hp";
            return _basics;
          }
          if (borg.trait[0x24] < 4) {
            _basics = "4 clevel";
            return _basics;
          }
          break;
        case 1:
        case 4:
          if (borg.trait[0x1c] < 0x3c) {
            _basics = "60 hp";
            return _basics;
          }
          if (borg.trait[0x24] < 0xb) {
            _basics = "11 clevel";
            return _basics;
          }
          break;
        case 2:
        case 3:
          if (borg.trait[0x1c] < 0x28) {
            _basics = "40 hp";
            return _basics;
          }
          if (borg.trait[0x24] < 9) {
            _basics = "9 level";
            return _basics;
          }
          break;
        case 5:
          if (borg.trait[0x1c] < 0x32) {
            _basics = "50 hp";
            return _basics;
          }
          if (borg.trait[0x24] < 4) {
            _basics = "4 clevel";
            return _basics;
          }
          break;
        case 6:
          if (borg.trait[0x1c] < 0x32) {
            _basics = "50 hp";
            return _basics;
          }
          if (borg.trait[0x24] < 8) {
            _basics = "8 clevel";
            return _basics;
          }
          break;
        case 7:
          if (borg.trait[0x1c] < 0x32) {
            _basics = "50 hp";
            return _basics;
          }
          if (borg.trait[0x24] < 4) {
            _basics = "4 clevel";
            return _basics;
          }
        }
      }
      if ((borg.trait[0x24] < 0x1e) && (borg.trait[0xe9] + borg.trait[0xe8] + borg.trait[0xe7] < 2))
      {
        _basics = "2 cure";
      }
      else if (depth < L'\x05') {
        _basics = (char *)0x0;
      }
      else {
        if ((borg_cfg[10] == 0) && (borg.trait[0x69] != 0)) {
          switch(borg.trait[0x19]) {
          case 0:
          case 8:
            if (borg.trait[0x1c] < 0x3c) {
              _basics = "60 hp";
              return _basics;
            }
            if (borg.trait[0x24] < 6) {
              _basics = "6 clevel";
              return _basics;
            }
            break;
          case 1:
          case 4:
            if (borg.trait[0x1c] < 0x50) {
              _basics = "80 hp";
              return _basics;
            }
            if (borg.trait[0x24] < 0xf) {
              _basics = "15 level";
              return _basics;
            }
            break;
          case 2:
          case 3:
            if (borg.trait[0x1c] < 0x3c) {
              _basics = "60 hp";
              return _basics;
            }
            if (borg.trait[0x24] < 0xf) {
              _basics = "15 clevel";
              return _basics;
            }
            break;
          case 5:
            if (borg.trait[0x1c] < 0x3c) {
              _basics = "60 hp";
              return _basics;
            }
            if (borg.trait[0x24] < 6) {
              _basics = "6 clevel";
              return _basics;
            }
            break;
          case 6:
            if (borg.trait[0x1c] < 0x3c) {
              _basics = "60 hp";
              return _basics;
            }
            if (borg.trait[0x24] < 10) {
              _basics = "10 clevel";
              return _basics;
            }
            break;
          case 7:
            if (borg.trait[0x1c] < 0x3c) {
              _basics = "60 hp";
              return _basics;
            }
            if (borg.trait[0x24] < 6) {
              _basics = "6 clevel";
              return _basics;
            }
          }
        }
        if ((borg.trait[0x24] < 0x1e) &&
           (borg.trait[0xe9] + borg.trait[0xe8] + borg.trait[0xe7] < 2)) {
          _basics = "2 cures (clw + csw + ccw)";
        }
        else if (borg.trait[0x26] < 1) {
          _basics = "1 recall";
        }
        else if (depth < L'\n') {
          _basics = (char *)0x0;
        }
        else if ((borg.trait[0x1a] < 2) && (borg.trait[0x19] != 4)) {
          _basics = "2 light radius";
        }
        else if (borg.trait[0xd3] + borg.trait[0xd4] < 2) {
          _basics = "2 tele + teleport staffs";
        }
        else {
          if (borg_cfg[10] == 0) {
            switch(borg.trait[0x19]) {
            case 0:
            case 8:
              if ((borg.trait[0x24] < depth + L'\xfffffffc') && (depth < L'\x14')) {
                _basics = "dlevel - 4 >= clevel";
                return _basics;
              }
              break;
            case 1:
            case 4:
              if ((borg.trait[0x24] < depth + L'\x05') && (borg.trait[0x24] < 0x1d)) {
                _basics = "dlevel + 5 > = clevel";
                return _basics;
              }
              break;
            case 2:
            case 3:
              if ((borg.trait[0x24] < depth) && (depth < L'\x14')) {
                _basics = "dlevel >= clevel";
                return _basics;
              }
              break;
            case 5:
              if ((borg.trait[0x24] < depth) && (depth < L'\x14')) {
                _basics = "dlevel >= clevel";
                return _basics;
              }
              break;
            case 6:
              if ((borg.trait[0x24] < depth) && (depth < L'\x14')) {
                _basics = "dlevel >= clevel";
                return _basics;
              }
              break;
            case 7:
              if ((borg.trait[0x24] < depth) && (depth < L'\x14')) {
                _basics = "dlevel >= clevel";
                return _basics;
              }
            }
          }
          if ((borg.trait[0x24] < 0x1e) && (borg.trait[0xe7] < 3)) {
            _basics = "ccw < 3";
          }
          else if ((borg.trait[0x33] == 0) && ((borg.trait[0x103] == 0 && (borg.trait[0x25] == 0))))
          {
            _basics = "See Invis : ESP";
          }
          else if (depth < L'\x14') {
            _basics = (char *)0x0;
          }
          else if (borg.trait[0x56] == 0) {
            _basics = "free action";
          }
          else if (depth < L'\x15') {
            _basics = (char *)0x0;
          }
          else if (borg.trait[0x57] == 0) {
            _basics = "resist fire";
          }
          else if (borg.trait[0x48] + borg.trait[0x46] + borg.trait[0x47] < 2) {
            _basics = "2 basic resists";
          }
          else if (*borg.trait < 7) {
            _basics = "low STR";
          }
          else {
            iVar1 = borg_spell_stat();
            if ((iVar1 == -1) || (6 < borg.trait[iVar1])) {
              if (borg.trait[3] < 7) {
                _basics = "low DEX";
              }
              else if (borg.trait[4] < 7) {
                _basics = "low CON";
              }
              else {
                if (borg_cfg[10] == 0) {
                  switch(borg.trait[0x19]) {
                  case 0:
                  case 8:
                    if ((borg.trait[0x24] < depth + L'\x05') && (borg.trait[0x24] < 0x27)) {
                      _basics = "dlevel + 5 >= clevel";
                      return _basics;
                    }
                    break;
                  case 1:
                  case 4:
                    if ((borg.trait[0x24] < depth + L'\b') && (borg.trait[0x24] < 0x27)) {
                      _basics = "dlevel + 8 >= clevel";
                      return _basics;
                    }
                    if ((((borg.trait[0x24] + -0x26) * 2 + L'\x1e' < depth) &&
                        (borg.trait[0x24] < 0x2d)) && (0x26 < borg.trait[0x24])) {
                      _basics = "(clevel-38)*2+30 < dlevel";
                      return _basics;
                    }
                    break;
                  case 2:
                  case 3:
                    if ((borg.trait[0x24] < depth + L'\r') && (borg.trait[0x24] < 0x2f)) {
                      _basics = "dlevel + 13 >= clevel";
                      return _basics;
                    }
                    break;
                  case 5:
                    if ((borg.trait[0x24] < depth + L'\a') && (borg.trait[0x24] < 0x29)) {
                      _basics = "dlevel + 7 >= clevel";
                      return _basics;
                    }
                    break;
                  case 6:
                    if ((borg.trait[0x24] < depth + L'\n') && (borg.trait[0x24] < 0x2c)) {
                      _basics = "dlevel + 10 >= clevel";
                      return _basics;
                    }
                    break;
                  case 7:
                    if (((borg.trait[0x24] < depth + L'\b') && (borg.trait[0x24] < 0x2a)) &&
                       (0x1c < borg.trait[0x24])) {
                      _basics = "dlevel + 8 >= clevel";
                      return _basics;
                    }
                  }
                }
                if (depth < L'\x1a') {
                  _basics = (char *)0x0;
                }
                else if (borg.trait[0x58] == 0) {
                  _basics = "resist cold";
                }
                else if (borg.trait[0x59] == 0) {
                  _basics = "resist elec";
                }
                else if (borg.trait[0x5a] == 0) {
                  _basics = "resist acid";
                }
                else if (borg.trait[0xd3] + borg.trait[0xd4] < 6) {
                  _basics = "6 tell + telep staffs";
                }
                else if ((borg.trait[0x24] < 0x1e) && (borg.trait[0xe7] + borg.trait[0xe8] < 10)) {
                  _basics = "10 ccw + csw";
                }
                else if (depth < L'\"') {
                  _basics = (char *)0x0;
                }
                else if ((borg.trait[0x24] < 0x28) && (borg_cfg[10] == 0)) {
                  _basics = "level 40";
                }
                else if (depth < L'(') {
                  _basics = (char *)0x0;
                }
                else if (borg.trait[0x5b] == 0) {
                  _basics = "resist pois";
                }
                else if (borg.trait[0x60] == 0) {
                  _basics = "resist conf";
                }
                else if (*borg.trait < 0x10) {
                  _basics = "STR < 16";
                }
                else if ((iVar1 == -1) || (0xf < borg.trait[iVar1])) {
                  if (borg.trait[3] < 0x10) {
                    _basics = "dex < 16";
                  }
                  else if (borg.trait[4] < 0x10) {
                    _basics = "con < 16";
                  }
                  else if (depth < L'.') {
                    _basics = (char *)0x0;
                  }
                  else if (borg.trait[0x2c] < 0x73) {
                    _basics = "+5 speed";
                  }
                  else if ((borg.trait[0xd6] < 1) && (borg.trait[0xd7] < 1)) {
                    _basics = "1 heal";
                  }
                  else if ((borg_cfg[10] == 0) && (borg.trait[0x1c] < 500)) {
                    _basics = "HP 500";
                  }
                  else if (*borg.trait < 0x3a) {
                    _basics = "str < 18(40)";
                  }
                  else if ((iVar1 == -1) || (0x75 < borg.trait[iVar1])) {
                    if (borg.trait[3] < 0x4e) {
                      _basics = "dex < 18 (60)";
                    }
                    else if (borg.trait[4] < 0x4e) {
                      _basics = "con < 18 (60)";
                    }
                    else if ((borg.trait[0x67] == 0) && (borg.trait[0x24] < 0x32)) {
                      _basics = "hold life";
                    }
                    else if (depth < L'8') {
                      _basics = (char *)0x0;
                    }
                    else if ((borg.trait[0xd6] < 2) && (borg.trait[0xd7] < 1)) {
                      _basics = "2 heal + *heal*";
                    }
                    else if (borg.trait[0x5f] == 0) {
                      _basics = "resist blind";
                    }
                    else if (borg.trait[0x25] == 0) {
                      _basics = "ESP";
                    }
                    else if (depth < L'<') {
                      _basics = (char *)0x0;
                    }
                    else if (borg.trait[0x2c] < 0x78) {
                      _basics = "+10 speed";
                    }
                    else if (borg.trait[0x65] == 0) {
                      _basics = "resist chaos";
                    }
                    else if (borg.trait[0x66] == 0) {
                      _basics = "resist disenchant";
                    }
                    else if (depth < L'Q') {
                      _basics = (char *)0x0;
                    }
                    else if (borg.trait[0x2c] < 0x82) {
                      _basics = "+20 Speed";
                    }
                    else if (depth < L'V') {
                      _basics = (char *)0x0;
                    }
                    else if (depth < L'd') {
                      _basics = (char *)0x0;
                    }
                    else {
                      if (borg.trait[0x6b] == 0) {
                        if ((100 < borg.trait[0x1f]) && (borg.has[kv_potion_restore_mana] < 0xf)) {
                          _basics = "10 restore mana";
                          return _basics;
                        }
                        if (borg.has[kv_potion_healing] < 5) {
                          _basics = "5 Heal";
                          return _basics;
                        }
                        if (borg.trait[0xd7] + borg.trait[0xd8] < 0xf) {
                          _basics = "15 *heal* or life";
                          return _basics;
                        }
                        if (borg.trait[0xda] < 10) {
                          _basics = "10 speed potions";
                          return _basics;
                        }
                      }
                      if (depth < L'\x80') {
                        _basics = (char *)0x0;
                      }
                      else {
                        _basics = (char *)0x0;
                      }
                    }
                  }
                  else {
                    _basics = "spell stat needs to be max";
                  }
                }
                else {
                  _basics = "spell stat < 16";
                }
              }
            }
            else {
              _basics = "low spell stat";
            }
          }
        }
      }
    }
  }
  else {
    borg.ready_morgoth = L'\x01';
    _basics = (char *)0x0;
  }
  return _basics;
}

Assistant:

static const char *borg_prepared_aux(int depth)
{
    if (-1 == borg.ready_morgoth)
        borg.ready_morgoth = 0;
    if (borg.trait[BI_KING]) {
        borg.ready_morgoth = 1;
        return (NULL);
    }

    /* Always ready for the town */
    if (!depth)
        return (NULL);

    /*** Essential Items for Level 1 ***/

    /* Require lite (any) */
    if (borg.trait[BI_LIGHT] < 1)
        return ("1 Lite");

    /* Require food */
    if (borg.trait[BI_FOOD] < 5)
        return ("5 Food");

    /* Usually ready for level 1 */
    if (depth <= 1)
        return ((char *)NULL);

    /*** Essential Items for Level 2 ***/

    /* Require fuel */
    if (borg.trait[BI_AFUEL] < 5 && !borg.trait[BI_LIGHT])
        return ("5 Fuel");

    /* Require recall */
    /* if (borg.trait[BI_RECALL] < 1) return ("1 recall"); */

    if (!borg_cfg[BORG_PLAYS_RISKY]) {
        /* Require 30 hp */
        if (borg.trait[BI_MAXHP] < 30)
            return ("30 hp");
    }

    /* Usually ready for level 2 */
    if (depth <= 2)
        return ((char *)NULL);

    /*** Essential Items for Level 3 and 4 ***/

    if (!borg_cfg[BORG_PLAYS_RISKY]) {
        /* class specific requirement */
        switch (borg.trait[BI_CLASS]) {
        case CLASS_WARRIOR:
        case CLASS_BLACKGUARD:
            if (borg.trait[BI_MAXHP] < 50)
                return ("50 hp");
            if (borg.trait[BI_MAXCLEVEL] < 4)
                return ("4 clevel");
            break;
        case CLASS_ROGUE:
            if (borg.trait[BI_MAXHP] < 50)
                return ("50 hp");
            if (borg.trait[BI_MAXCLEVEL] < 8)
                return ("8 clevel");
            break;
        case CLASS_PRIEST:
        case CLASS_DRUID:
            if (borg.trait[BI_MAXHP] < 40)
                return ("40 hp");
            if (borg.trait[BI_MAXCLEVEL] < 9)
                return ("9 level");
            break;
        case CLASS_PALADIN:
            if (borg.trait[BI_MAXHP] < 50)
                return ("50 hp");
            if (borg.trait[BI_MAXCLEVEL] < 4)
                return ("4 clevel");
            break;
        case CLASS_RANGER:
            if (borg.trait[BI_MAXHP] < 50)
                return ("50 hp");
            if (borg.trait[BI_MAXCLEVEL] < 4)
                return ("4 clevel");
            break;
        case CLASS_MAGE:
        case CLASS_NECROMANCER:
            if (borg.trait[BI_MAXHP] < 60)
                return ("60 hp");
            if (borg.trait[BI_MAXCLEVEL] < 11)
                return ("11 clevel");
            break;
        }
    }

    /* Potions of Cure Serious Wounds */
    if ((borg.trait[BI_MAXCLEVEL] < 30)
        && borg.trait[BI_ACLW] + borg.trait[BI_ACSW] + borg.trait[BI_ACCW] < 2)
        return ("2 cure");

    /* Usually ready for level 3 and 4 */
    if (depth <= 4)
        return ((char *)NULL);

    /*** Essential Items for Level 5 to 9 ***/

    if (!borg_cfg[BORG_PLAYS_RISKY]) {
        /* class specific requirement */
        if (borg.trait[BI_CDEPTH]) {
            switch (borg.trait[BI_CLASS]) {
            case CLASS_WARRIOR:
            case CLASS_BLACKGUARD:
                if (borg.trait[BI_MAXHP] < 60)
                    return ("60 hp");
                if (borg.trait[BI_MAXCLEVEL] < 6)
                    return ("6 clevel");
                break;
            case CLASS_ROGUE:
                if (borg.trait[BI_MAXHP] < 60)
                    return ("60 hp");
                if (borg.trait[BI_MAXCLEVEL] < 10)
                    return ("10 clevel");
                break;
            case CLASS_PRIEST:
            case CLASS_DRUID:
                if (borg.trait[BI_MAXHP] < 60)
                    return ("60 hp");
                if (borg.trait[BI_MAXCLEVEL] < 15)
                    return ("15 clevel");
                break;
            case CLASS_PALADIN:
                if (borg.trait[BI_MAXHP] < 60)
                    return ("60 hp");
                if (borg.trait[BI_MAXCLEVEL] < 6)
                    return ("6 clevel");
                break;
            case CLASS_RANGER:
                if (borg.trait[BI_MAXHP] < 60)
                    return ("60 hp");
                if (borg.trait[BI_MAXCLEVEL] < 6)
                    return ("6 clevel");
                break;
            case CLASS_MAGE:
            case CLASS_NECROMANCER:
                if (borg.trait[BI_MAXHP] < 80)
                    return ("80 hp");
                if (borg.trait[BI_MAXCLEVEL] < 15)
                    return ("15 level");
                break;
            }
        }
    }

    /* Potions of Cure Serious/Critical Wounds */
    if ((borg.trait[BI_MAXCLEVEL] < 30)
        && borg.trait[BI_ACLW] + borg.trait[BI_ACSW] + borg.trait[BI_ACCW] < 2)
        return ("2 cures (clw + csw + ccw)");

    /* Scrolls of Word of Recall */
    if (borg.trait[BI_RECALL] < 1)
        return ("1 recall");

    /* Usually ready for level 5 to 9 */
    if (depth <= 9)
        return ((char *)NULL);

    /*** Essential Items for Level 10 to 19 ***/

    /* Require light (radius 2) */    /* necromancers like the dark */
    if (borg.trait[BI_LIGHT] < 2
        && (borg.trait[BI_CLASS] != CLASS_NECROMANCER))
        return "2 light radius";

    /* Escape or Teleport */
    if (borg.trait[BI_ATELEPORT] + borg.trait[BI_AESCAPE] < 2)
        return ("2 tele + teleport staffs");

    if (!borg_cfg[BORG_PLAYS_RISKY]) {
        /* class specific requirement */
        switch (borg.trait[BI_CLASS]) {
        case CLASS_WARRIOR:
        case CLASS_BLACKGUARD:
            if (borg.trait[BI_MAXCLEVEL] < (depth - 4) && depth <= 19)
                return ("dlevel - 4 >= clevel");
            break;
        case CLASS_ROGUE:
            if (borg.trait[BI_MAXCLEVEL] < depth && depth <= 19)
                return ("dlevel >= clevel");
            break;
        case CLASS_PRIEST:
        case CLASS_DRUID:
            if (borg.trait[BI_MAXCLEVEL] < depth && depth <= 19)
                return ("dlevel >= clevel");
            break;
        case CLASS_PALADIN:
            if (borg.trait[BI_MAXCLEVEL] < depth && depth <= 19)
                return ("dlevel >= clevel");
            break;
        case CLASS_RANGER:
            if (borg.trait[BI_MAXCLEVEL] < depth && depth <= 19)
                return ("dlevel >= clevel");
            break;
        case CLASS_MAGE:
        case CLASS_NECROMANCER:
            if (borg.trait[BI_MAXCLEVEL] < (depth + 5)
                && borg.trait[BI_MAXCLEVEL] <= 28)
                return ("dlevel + 5 > = clevel");
            break;
        }
    }

    /* Potions of Cure Critical Wounds */
    if ((borg.trait[BI_MAXCLEVEL] < 30) && borg.trait[BI_ACCW] < 3)
        return ("ccw < 3");

    /* See invisible */
    /* or telepathy */
    if ((!borg.trait[BI_SINV] && !borg.trait[BI_DINV] && !borg.trait[BI_ESP]))
        return ("See Invis : ESP");

    /* Usually ready for level 10 to 19 */
    if (depth <= 19)
        return ((char *)NULL);

    /*** Essential Items for Level 20 ***/

    /* Free action */
    if (!borg.trait[BI_FRACT])
        return ("free action");

    /* ready for level 20 */
    if (depth <= 20)
        return ((char *)NULL);

    /*** Essential Items for Level 25 ***/

    /* must have fire + 2 other basic resists */
    if (!borg.trait[BI_SRFIRE])
        return ("resist fire");
    {
        int basics = borg.trait[BI_RACID] + borg.trait[BI_RCOLD]
                     + borg.trait[BI_RELEC];

        if (basics < 2)
            return ("2 basic resists");
    }
    /* have some minimal stats */
    if (borg.trait[BI_STR] < 7)
        return ("low STR");

    int spell_stat = borg_spell_stat();
    if (spell_stat != -1) {
        if (borg.trait[BI_STR + spell_stat] < 7)
            return ("low spell stat");
    }
    if (borg.trait[BI_DEX] < 7)
        return ("low DEX");
    if (borg.trait[BI_CON] < 7)
        return ("low CON");

    if (!borg_cfg[BORG_PLAYS_RISKY]) {
        /* class specific requirement */
        switch (borg.trait[BI_CLASS]) {
        case CLASS_WARRIOR:
        case CLASS_BLACKGUARD:
            if (borg.trait[BI_MAXCLEVEL] < (depth + 5)
                && borg.trait[BI_MAXCLEVEL] <= 38)
                return ("dlevel + 5 >= clevel");
            break;
        case CLASS_ROGUE:
            if (borg.trait[BI_MAXCLEVEL] < (depth + 10)
                && borg.trait[BI_MAXCLEVEL] <= 43)
                return ("dlevel + 10 >= clevel");
            break;
        case CLASS_PRIEST:
        case CLASS_DRUID:
            if (borg.trait[BI_MAXCLEVEL] < (depth + 13)
                && borg.trait[BI_MAXCLEVEL] <= 46)
                return ("dlevel + 13 >= clevel");
            break;
        case CLASS_PALADIN:
            if (borg.trait[BI_MAXCLEVEL] < (depth + 7)
                && borg.trait[BI_MAXCLEVEL] <= 40)
                return ("dlevel + 7 >= clevel");
            break;
        case CLASS_RANGER:
            if (borg.trait[BI_MAXCLEVEL] < (depth + 8)
                && borg.trait[BI_MAXCLEVEL] <= 41
                && borg.trait[BI_MAXCLEVEL] > 28)
                return ("dlevel + 8 >= clevel");
            break;
        case CLASS_MAGE:
        case CLASS_NECROMANCER:
            if (borg.trait[BI_MAXCLEVEL] < (depth + 8)
                && borg.trait[BI_MAXCLEVEL] <= 38)
                return ("dlevel + 8 >= clevel");
            if (((borg.trait[BI_MAXCLEVEL] - 38) * 2 + 30) < depth
                && borg.trait[BI_MAXCLEVEL] <= 44
                && borg.trait[BI_MAXCLEVEL] > 38)
                return ("(clevel-38)*2+30 < dlevel");
            break;
        }
    }

    /* Ready for level 25 */
    if (depth <= 25)
        return ((char *)NULL);

    /*** Essential Items for Level 25 to 39 ***/

    /* All Basic resistance*/
    if (!borg.trait[BI_SRCOLD])
        return ("resist cold");
    if (!borg.trait[BI_SRELEC])
        return ("resist elec");
    if (!borg.trait[BI_SRACID])
        return ("resist acid");

    /* Escape and Teleport */
    if (borg.trait[BI_ATELEPORT] + borg.trait[BI_AESCAPE] < 6)
        return ("6 tell + telep staffs");

    /* Cure Critical Wounds */
    if ((borg.trait[BI_MAXCLEVEL] < 30)
        && (borg.trait[BI_ACCW] + borg.trait[BI_ACSW]) < 10)
        return ("10 ccw + csw");

    /* Ready for level 33 */
    if (depth <= 33)
        return ((char *)NULL);

    /* Minimal level */
    if (borg.trait[BI_MAXCLEVEL] < 40 && !borg_cfg[BORG_PLAYS_RISKY])
        return ("level 40");

    /* Usually ready for level 20 to 39 */
    if (depth <= 39)
        return ((char *)NULL);

    /*** Essential Items for Level 40 to 45 ***/

    /* Resist */
    if (!borg.trait[BI_SRPOIS])
        return ("resist pois");
    if (!borg.trait[BI_SRCONF])
        return ("resist conf");

    if (borg.trait[BI_STR] < 16)
        return ("STR < 16");

    if (spell_stat != -1) {
        if (borg.trait[BI_STR + spell_stat] < 16)
            return ("spell stat < 16");
    }
    if (borg.trait[BI_DEX] < 16)
        return ("dex < 16");
    if (borg.trait[BI_CON] < 16)
        return ("con < 16");

    /* Ok to continue */
    if (depth <= 45)
        return ((char *)NULL);

    /*** Essential Items for Level 46 to 55 ***/

    /*  Must have +5 speed after level 46 */
    if (borg.trait[BI_SPEED] < 115)
        return ("+5 speed");

    /* Potions of heal */
    if (borg.trait[BI_AHEAL] < 1 && (borg.trait[BI_AEZHEAL] < 1))
        return ("1 heal");

    if (!borg_cfg[BORG_PLAYS_RISKY]) {
        /* Minimal hitpoints */
        if (borg.trait[BI_MAXHP] < 500)
            return ("HP 500");
    }

    /* High stats XXX XXX XXX */
    if (borg.trait[BI_STR] < 18 + 40)
        return ("str < 18(40)");

    if (spell_stat != -1) {
        if (borg.trait[BI_STR + spell_stat] < 18 + 100)
            return ("spell stat needs to be max");
    }
    if (borg.trait[BI_DEX] < 18 + 60)
        return ("dex < 18 (60)");
    if (borg.trait[BI_CON] < 18 + 60)
        return ("con < 18 (60)");

    /* Hold Life */
    if (!borg.trait[BI_SHLIFE] && (borg.trait[BI_MAXCLEVEL] < 50))
        return ("hold life");

    /* Usually ready for level 46 to 55 */
    if (depth <= 55)
        return ((char *)NULL);

    /*** Essential Items for Level 55 to 59 ***/

    /* Potions of heal */
    if (borg.trait[BI_AHEAL] < 2 && borg.trait[BI_AEZHEAL] < 1)
        return ("2 heal + *heal*");

    /* Resists */
    if (!borg.trait[BI_SRBLIND])
        return ("resist blind");

    /* Must have resist nether */
    /*    if (!borg_settings[BORG_PLAYS_RISKY] && !borg.trait[BI_SRNTHR]) return
     * ("resist nether"); */

    /* Telepathy, better have it by now */
    if (!borg.trait[BI_ESP])
        return ("ESP");

    /* Usually ready for level 55 to 59 */
    if (depth <= 59)
        return ((char *)NULL);

    /*** Essential Items for Level 61 to 80 ***/

    /* Must have +10 speed */
    if (borg.trait[BI_SPEED] < 120)
        return ("+10 speed");

    /* Resists */
    if (!borg.trait[BI_SRKAOS])
        return ("resist chaos");
    if (!borg.trait[BI_SRDIS])
        return ("resist disenchant");

    /* Usually ready for level 61 to 80 */
    if (depth <= 80)
        return ((char *)NULL);

    /*** Essential Items for Level 81-85 ***/
    /* Minimal Speed */
    if (borg.trait[BI_SPEED] < 130)
        return ("+20 Speed");

    /* Usually ready for level 81 to 85 */
    if (depth <= 85)
        return ((char *)NULL);

    /*** Essential Items for Level 86-99 ***/

    /* Usually ready for level 86 to 99 */
    if (depth <= 99)
        return ((char *)NULL);

    /*** Essential Items for Level 100 ***/

    /* must have lots of restore mana to go after MORGOTH */
    if (!borg.trait[BI_KING]) {
        if ((borg.trait[BI_MAXSP] > 100)
            && (borg.has[kv_potion_restore_mana] < 15))
            return ("10 restore mana");

        /* must have lots of heal */
        if (borg.has[kv_potion_healing] < 5)
            return ("5 Heal");

        /* must have lots of ez-heal */
        if ((borg.trait[BI_AEZHEAL] + borg.trait[BI_ALIFE]) < 15)
            return ("15 *heal* or life");

        /* must have lots of speed */
        if (borg.trait[BI_ASPEED] < 10)
            return ("10 speed potions");
    }

    /* Its good to be the king */
    if (depth <= 127)
        return ((char *)NULL);

    /* all bases covered */
    return ((char *)NULL);
}